

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::build(TranslateToFuzzReader *this)

{
  uint uVar1;
  
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    prepareHangLimitSupport(this);
  }
  if (this->allowMemory == true) {
    setupMemory(this);
  }
  setupHeapTypes(this);
  setupTables(this);
  setupGlobals(this);
  uVar1 = *(uint *)(this->wasm + 0x178);
  if ((uVar1 & 0x40) != 0) {
    setupTags(this);
    addImportThrowingSupport(this);
    uVar1 = *(uint *)(this->wasm + 0x178);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    addImportTableSupport(this);
  }
  addImportLoggingSupport(this);
  addImportCallingSupport(this);
  addImportSleepSupport(this);
  modifyInitialFunctions(this);
  processFunctions(this);
  if (0 < (this->fuzzParams->super_FuzzParams).HANG_LIMIT) {
    addHangLimitSupport(this);
  }
  if (this->allowMemory == true) {
    finalizeMemory(this);
    addHashMemorySupport(this);
  }
  finalizeTable(this);
  shuffleExports(this);
  return;
}

Assistant:

void TranslateToFuzzReader::build() {
  if (fuzzParams->HANG_LIMIT > 0) {
    prepareHangLimitSupport();
  }
  if (allowMemory) {
    setupMemory();
  }
  setupHeapTypes();
  setupTables();
  setupGlobals();
  if (wasm.features.hasExceptionHandling()) {
    setupTags();
    addImportThrowingSupport();
  }
  if (wasm.features.hasReferenceTypes()) {
    addImportTableSupport();
  }
  addImportLoggingSupport();
  addImportCallingSupport();
  addImportSleepSupport();
  modifyInitialFunctions();
  processFunctions();
  if (fuzzParams->HANG_LIMIT > 0) {
    addHangLimitSupport();
  }
  if (allowMemory) {
    finalizeMemory();
    addHashMemorySupport();
  }
  finalizeTable();
  shuffleExports();
}